

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

int Sdm_ManCanRead(void)

{
  FILE *__stream;
  FILE *pFile;
  char *pFileName;
  
  __stream = fopen("dsdfuncs6.dat","rb");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  pFileName._4_4_ = (uint)(__stream != (FILE *)0x0);
  return pFileName._4_4_;
}

Assistant:

int Sdm_ManCanRead()
{
    char * pFileName = "dsdfuncs6.dat";
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
        return 0;
    fclose( pFile );
    return 1;
}